

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  UnifiedVectorFormat *pUVar2;
  int64_t *piVar3;
  int32_t *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar11;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar12;
  reference vector;
  UnifiedVectorFormat *pUVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  int64_t iVar16;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar17;
  VectorType VVar18;
  ulong uVar19;
  UnifiedVectorFormat *pUVar20;
  UnifiedVectorFormat *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  reference local_98;
  ulong local_90;
  long local_88;
  unsigned_long local_80;
  optional_ptr<duckdb::FunctionLocalState,_true> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_78);
  oVar11.ptr = local_78.ptr;
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  VVar18 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar18);
    lVar6 = *(long *)(result + 0x20);
    lVar7 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)(lVar7 + (long)pUVar17 * 4),(ValidityMask *)pVVar1
                              ,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar16;
          pUVar17 = pUVar17 + 1;
        } while (pUVar2 != pUVar17);
      }
    }
    else {
      *(UnifiedVectorFormat **)(result + 0x40) = pUVar2;
      local_a8 = pUVar2;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)(vector + 0x28),(unsigned_long *)&local_a8);
      p_Var10 = p_Stack_70;
      oVar12.ptr = local_78.ptr;
      local_78.ptr = (FunctionLocalState *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(FunctionLocalState **)(result + 0x30) = oVar12.ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
      if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
         p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      *(unsigned_long **)pVVar1 =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if ((UnifiedVectorFormat *)0x3f < pUVar2 + 0x3f) {
        local_90 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        local_98 = vector + 0x28;
        do {
          if (*(long *)local_98 == 0) {
            pUVar13 = pUVar17 + 0x40;
            if (pUVar2 <= pUVar17 + 0x40) {
              pUVar13 = pUVar2;
            }
LAB_005c575b:
            pUVar20 = pUVar17;
            if (pUVar17 < pUVar13) {
              do {
                iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                   ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                    (oVar11.ptr + 8),(date_t)*(int32_t *)(lVar7 + (long)pUVar17 * 4)
                                    ,(ValidityMask *)pVVar1,(idx_t)pUVar17);
                *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar16;
                pUVar17 = pUVar17 + 1;
                pUVar20 = pUVar13;
              } while (pUVar13 != pUVar17);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)local_98 + local_90 * 8);
            pUVar13 = pUVar17 + 0x40;
            if (pUVar2 <= pUVar17 + 0x40) {
              pUVar13 = pUVar2;
            }
            pUVar20 = pUVar13;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_005c575b;
              pUVar20 = pUVar17;
              if (pUVar17 < pUVar13) {
                local_88 = lVar7 + (long)pUVar17 * 4;
                uVar19 = 0;
                do {
                  if ((uVar5 >> (uVar19 & 0x3f) & 1) != 0) {
                    iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                       ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                        (oVar11.ptr + 8),(date_t)*(int32_t *)(local_88 + uVar19 * 4)
                                        ,(ValidityMask *)pVVar1,(idx_t)(pUVar17 + uVar19));
                    *(int64_t *)(lVar6 + (long)pUVar17 * 8 + uVar19 * 8) = iVar16;
                  }
                  uVar19 = uVar19 + 1;
                  pUVar20 = pUVar13;
                } while ((long)pUVar13 - (long)pUVar17 != uVar19);
              }
            }
          }
          local_90 = local_90 + 1;
          pUVar17 = pUVar20;
        } while (local_90 != (ulong)(pUVar2 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar18);
    piVar3 = *(int64_t **)(result + 0x20);
    piVar4 = *(int32_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar11.ptr + 8),
                          (date_t)*piVar4,(ValidityMask *)(result + 0x28),0);
      *piVar3 = iVar16;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar2);
    duckdb::Vector::SetVectorType(VVar18);
    oVar12.ptr = local_78.ptr;
    lVar6 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (local_68 == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        lVar7 = *(long *)oVar12.ptr;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar13 = pUVar17;
          if (lVar7 != 0) {
            pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
          }
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)((long)p_Stack_70 + (long)pUVar13 * 4),
                              (ValidityMask *)pVVar1,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar16;
          pUVar17 = pUVar17 + 1;
        } while (pUVar2 != pUVar17);
      }
    }
    else if (pUVar2 != (UnifiedVectorFormat *)0x0) {
      lVar7 = *(long *)oVar12.ptr;
      pUVar17 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar13 = pUVar17;
        if (lVar7 != 0) {
          pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1) == 0)
        {
          _Var15._M_head_impl = *(unsigned_long **)pVVar1;
          if (_Var15._M_head_impl == (unsigned_long *)0x0) {
            local_80 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            pUVar13 = local_a8;
            local_a8 = (UnifiedVectorFormat *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar13;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
            if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var15._M_head_impl =
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)pVVar1 = _Var15._M_head_impl;
          }
          bVar9 = (byte)pUVar17 & 0x3f;
          _Var15._M_head_impl[(ulong)pUVar17 >> 6] =
               _Var15._M_head_impl[(ulong)pUVar17 >> 6] &
               (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
        else {
          iVar16 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)((long)p_Stack_70 + (long)pUVar13 * 4),
                              (ValidityMask *)pVVar1,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar16;
        }
        pUVar17 = pUVar17 + 1;
      } while (pUVar2 != pUVar17);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}